

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<capnp::compiler::Resolution> * __thiscall
kj::ArrayBuilder<capnp::compiler::Resolution>::operator=
          (ArrayBuilder<capnp::compiler::Resolution> *this,
          ArrayBuilder<capnp::compiler::Resolution> *other)

{
  ArrayBuilder<capnp::compiler::Resolution> *other_local;
  ArrayBuilder<capnp::compiler::Resolution> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (Resolution *)0x0;
  other->pos = (RemoveConst<capnp::compiler::Resolution> *)0x0;
  other->endPtr = (Resolution *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }